

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Action<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)> *
__thiscall
testing::internal::
TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
::GetCurrentAction(TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
                   *this,FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
                         *mocker,ArgumentTuple *args)

{
  int iVar1;
  ostream *poVar2;
  Action<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  *pAVar3;
  char *pcVar4;
  int iVar5;
  string sStack_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  iVar1 = ExpectationBase::call_count(&this->super_ExpectationBase);
  std::__cxx11::string::string
            ((string *)&ss,
             "call_count() is <= 0 when GetCurrentAction() is called - this should never happen.",
             (allocator *)&sStack_1d8);
  Assert(0 < iVar1,
         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googlemock/include/gmock/gmock-spec-builders.h"
         ,0x494,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  iVar5 = (int)((ulong)((long)(this->super_ExpectationBase).untyped_actions_.
                              super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_ExpectationBase).untyped_actions_.
                             super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3);
  if (((0 < iVar5) && (iVar5 < iVar1)) &&
     ((this->super_ExpectationBase).repeated_action_specified_ == false)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    ExpectationBase::DescribeLocationTo(&this->super_ExpectationBase,local_1a8);
    poVar2 = std::operator<<(local_1a8,"Actions ran out in ");
    poVar2 = std::operator<<(poVar2,(this->super_ExpectationBase).source_text_._M_dataplus._M_p);
    poVar2 = std::operator<<(poVar2,"...\n");
    poVar2 = std::operator<<(poVar2,"Called ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2," times, but only ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar5);
    poVar2 = std::operator<<(poVar2," WillOnce()");
    pcVar4 = "s are";
    if (iVar5 == 1) {
      pcVar4 = " is";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::operator<<(poVar2," specified - ");
    FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
    ::DescribeDefaultActionTo(mocker,args,local_1a8);
    std::__cxx11::stringbuf::str();
    Log(kWarning,&sStack_1d8,1);
    std::__cxx11::string::~string((string *)&sStack_1d8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  if (iVar5 < iVar1) {
    pAVar3 = &this->repeated_action_;
  }
  else {
    pAVar3 = (Action<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
              *)(this->super_ExpectationBase).untyped_actions_.
                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                super__Vector_impl_data._M_start[(long)iVar1 + -1];
  }
  return pAVar3;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    const int count = call_count();
    Assert(count >= 1, __FILE__, __LINE__,
           "call_count() is <= 0 when GetCurrentAction() is "
           "called - this should never happen.");

    const int action_count = static_cast<int>(untyped_actions_.size());
    if (action_count > 0 && !repeated_action_specified_ &&
        count > action_count) {
      // If there is at least one WillOnce() and no WillRepeatedly(),
      // we warn the user when the WillOnce() clauses ran out.
      ::std::stringstream ss;
      DescribeLocationTo(&ss);
      ss << "Actions ran out in " << source_text() << "...\n"
         << "Called " << count << " times, but only "
         << action_count << " WillOnce()"
         << (action_count == 1 ? " is" : "s are") << " specified - ";
      mocker->DescribeDefaultActionTo(args, &ss);
      Log(kWarning, ss.str(), 1);
    }

    return count <= action_count
               ? *static_cast<const Action<F>*>(
                     untyped_actions_[static_cast<size_t>(count - 1)])
               : repeated_action();
  }